

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O1

void __thiscall embree::ISPCScene::ISPCScene(ISPCScene *this,RTCDevice device,TutorialScene *in)

{
  uint uVar1;
  Node *pNVar2;
  int iVar3;
  RTCScene pRVar4;
  ISPCGeometry **ppIVar5;
  pointer pRVar6;
  ISPCGeometry *pIVar7;
  ISPCMaterial **ppIVar8;
  pointer pRVar9;
  undefined4 extraout_var;
  Light **ppLVar10;
  pointer pRVar11;
  Light *pLVar12;
  ulong uVar13;
  ulong uVar14;
  Ref<embree::SceneGraph::LightNode> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  pRVar4 = (RTCScene)rtcNewScene(device);
  this->scene = pRVar4;
  this->tutorialScene = in;
  SceneGraph::opaque_geometry_destruction = deleteGeometry;
  ppIVar5 = (ISPCGeometry **)
            alignedUSMMalloc((long)(in->geometries).
                                   super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(in->geometries).
                                   super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,0x10,DEVICE_READ_ONLY);
  this->geometries = ppIVar5;
  pRVar6 = (in->geometries).
           super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((in->geometries).
      super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == pRVar6) {
    uVar13 = 0;
  }
  else {
    uVar14 = 0;
    do {
      pNVar2 = pRVar6[uVar14].ptr;
      local_38.ptr = pNVar2;
      if (pNVar2 != (Node *)0x0) {
        (*(pNVar2->super_RefCount)._vptr_RefCount[2])(pNVar2);
      }
      pIVar7 = convertGeometry(device,in,&local_38);
      this->geometries[uVar14] = pIVar7;
      if (pNVar2 != (Node *)0x0) {
        (*(pNVar2->super_RefCount)._vptr_RefCount[3])(pNVar2);
      }
      uVar14 = uVar14 + 1;
      pRVar6 = (in->geometries).
               super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = (long)(in->geometries).
                     super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar6 >> 3;
    } while (uVar14 < uVar13);
  }
  this->numGeometries = (uint)uVar13;
  ppIVar8 = (ISPCMaterial **)
            alignedUSMMalloc((long)(in->materials).
                                   super__Vector_base<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(in->materials).
                                   super__Vector_base<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,0x10,DEVICE_READ_ONLY);
  this->materials = ppIVar8;
  pRVar9 = (in->materials).
           super__Vector_base<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((in->materials).
      super__Vector_base<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == pRVar9) {
    uVar13 = 0;
  }
  else {
    uVar14 = 0;
    do {
      iVar3 = (*((pRVar9[uVar14].ptr)->super_Node).super_RefCount._vptr_RefCount[0xf])();
      this->materials[uVar14] = (ISPCMaterial *)CONCAT44(extraout_var,iVar3);
      uVar14 = uVar14 + 1;
      pRVar9 = (in->materials).
               super__Vector_base<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = (long)(in->materials).
                     super__Vector_base<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar9 >> 3;
    } while (uVar14 < uVar13);
  }
  this->numMaterials = (uint)uVar13;
  ppLVar10 = (Light **)
             alignedUSMMalloc((long)(in->lights).
                                    super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(in->lights).
                                    super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,0x10,DEVICE_READ_ONLY)
  ;
  this->lights = ppLVar10;
  this->numLights = 0;
  pRVar11 = (in->lights).
            super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((in->lights).
      super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pRVar11) {
    uVar13 = 0;
    do {
      (*((pRVar11[uVar13].ptr)->super_Node).super_RefCount._vptr_RefCount[0x12])(0,&local_40);
      pLVar12 = convertLight(&local_40);
      if (local_40.ptr != (LightNode *)0x0) {
        (*((local_40.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      if (pLVar12 != (Light *)0x0) {
        uVar1 = this->numLights;
        this->numLights = uVar1 + 1;
        this->lights[uVar1] = pLVar12;
      }
      uVar13 = uVar13 + 1;
      pRVar11 = (in->lights).
                super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(in->lights).
                                    super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar11 >> 3)
            );
  }
  return;
}

Assistant:

ISPCScene::ISPCScene(RTCDevice device, TutorialScene* in)
    : scene(rtcNewScene(device)), tutorialScene(in)
  {
    SceneGraph::opaque_geometry_destruction = (void(*)(void*)) deleteGeometry;

    geometries = (ISPCGeometry**) alignedUSMMalloc(sizeof(ISPCGeometry*)*in->geometries.size());

    for (size_t i=0; i<in->geometries.size(); i++)
      geometries[i] = convertGeometry(device,in,in->geometries[i]);
    numGeometries = unsigned(in->geometries.size());
    
    materials = (ISPCMaterial**) alignedUSMMalloc(sizeof(ISPCMaterial*)*in->materials.size());
    for (size_t i=0; i<in->materials.size(); i++)
      materials[i] = (ISPCMaterial*) in->materials[i]->material();
    numMaterials = unsigned(in->materials.size());
    
    lights = (Light**) alignedUSMMalloc(sizeof(Light*)*in->lights.size());
    numLights = 0;
    for (size_t i=0; i<in->lights.size(); i++)
    {
      Light* light = convertLight(in->lights[i]->get(0.0f));
      if (light) lights[numLights++] = light;
    }
  }